

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O3

AC3ParseError __thiscall AC3Codec::parseHeader(AC3Codec *this,uint8_t *buf,uint8_t *end)

{
  byte *pbVar1;
  ushort uVar2;
  uint8_t uVar3;
  bool bVar4;
  bool bVar5;
  uint8_t uVar6;
  int iVar7;
  uint uVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined4 uVar9;
  int iVar10;
  ushort *buffer;
  uint uVar11;
  ushort *puVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  byte bVar16;
  BitStreamReader gbc;
  BitStreamReader local_70;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  undefined4 local_3c;
  uint local_38;
  undefined4 local_34;
  
  if (*buf != '\v') {
    return SYNC;
  }
  if (buf[1] != 'w') {
    return SYNC;
  }
  bVar14 = buf[5];
  if (0x87 < bVar14) {
    return BSID;
  }
  buffer = (ushort *)(buf + 2);
  this->m_bsid = bVar14 >> 3;
  if (bVar14 < 0x58) {
    bVar14 = buf[4] >> 6;
    this->m_fscod = bVar14;
    if (bVar14 == 3) {
      return SAMPLE_RATE;
    }
    uVar8 = buf[4] & 0x3f;
    this->m_frmsizecod = uVar8;
    if (0x25 < (byte)uVar8) {
      return FRAME_SIZE;
    }
    uVar2 = ff_ac3_frame_sizes[uVar8][(uint)bVar14];
    this->m_frame_size = (uint)uVar2 + (uint)uVar2;
    pbVar1 = (byte *)((long)buffer + (ulong)((uint)uVar2 + (uint)uVar2));
    if (end + 2 < pbVar1) {
      return NOT_ENOUGH_BUFFER;
    }
    uVar8 = 0;
    if (2 < uVar2) {
      uVar8 = 0;
      do {
        uVar2 = *buffer;
        buffer = (ushort *)((long)buffer + 1);
        uVar8 = uVar8 >> 8 ^ (uint)ctx[(uint)(byte)uVar2 ^ uVar8 & 0xff];
      } while (buffer < pbVar1 + -4);
    }
    if (uVar8 == *buffer) {
      local_70.super_BitStream.m_totalBits = 0;
      local_70.super_BitStream.m_buffer = (uint *)0x0;
      local_70.super_BitStream.m_initBuffer = (uint *)0x0;
      local_70.m_curVal = 0;
      local_70.m_bitLeft = 0;
      BitStreamReader::setBuffer(&local_70,buf + 5,end);
      this->m_bsidBase = this->m_bsid;
      this->m_strmtyp = '\x02';
      this->m_samples = 0x600;
      BitStreamReader::skipBits(&local_70,5);
      uVar8 = BitStreamReader::getBits(&local_70,3);
      this->m_bsmod = (uint8_t)uVar8;
      uVar8 = BitStreamReader::getBits(&local_70,3);
      this->m_acmod = (uint8_t)uVar8;
      if ((uint8_t)uVar8 != '\x01' && (uVar8 & 1) != 0) {
        BitStreamReader::skipBits(&local_70,2);
        uVar8 = (uint)this->m_acmod;
      }
      uVar3 = (uint8_t)uVar8;
      if ((uVar8 & 4) != 0) {
        BitStreamReader::skipBits(&local_70,2);
        uVar3 = this->m_acmod;
      }
      if (uVar3 == '\x02') {
        uVar8 = BitStreamReader::getBits(&local_70,2);
        this->m_dsurmod = (uint8_t)uVar8;
      }
      uVar8 = BitStreamReader::getBits(&local_70,1);
      this->m_lfeon = (uint8_t)uVar8;
      bVar14 = this->m_bsid - 8;
      if (this->m_bsid < 8) {
        bVar14 = 0;
      }
      this->m_halfratecod = bVar14;
      this->m_sample_rate = (uint)(ff_ac3_freqs[this->m_fscod] >> (bVar14 & 0x1f));
      this->m_bit_rate = (uint)ff_ac3_bitratetab[this->m_frmsizecod >> 1] * 1000 >> (bVar14 & 0x1f);
      this->m_channels = (uint8_t)uVar8 + "\x02\x01\x02\x03\x03\x04\x04\x05"[this->m_acmod];
      return NO_ERROR;
    }
    return CRC2;
  }
  iVar7 = (buf[2] & 7) * 0x200;
  uVar8 = iVar7 + (uint)buf[3] * 2;
  uVar11 = iVar7 + (uint)buf[3] * 2 + 2;
  this->m_frame_size = uVar11;
  if (uVar8 < 5) {
    return FRAME_SIZE;
  }
  if (end + 2 < (byte *)((ulong)uVar11 + (long)buffer)) {
    return NOT_ENOUGH_BUFFER;
  }
  uVar11 = 0;
  puVar12 = buffer;
  do {
    uVar2 = *puVar12;
    puVar12 = (ushort *)((long)puVar12 + 1);
    uVar11 = uVar11 >> 8 ^ (uint)ctx[(uint)(byte)uVar2 ^ uVar11 & 0xff];
  } while (puVar12 < (ushort *)((long)buffer + ((ulong)uVar8 - 2)));
  if (uVar11 != *puVar12) {
    return CRC2;
  }
  local_70.super_BitStream.m_totalBits = 0;
  local_70.super_BitStream.m_buffer = (uint *)0x0;
  local_70.super_BitStream.m_initBuffer = (uint *)0x0;
  local_70.m_curVal = 0;
  local_70.m_bitLeft = 0;
  BitStreamReader::setBuffer(&local_70,(uint8_t *)buffer,end);
  uVar8 = BitStreamReader::getBits(&local_70,2);
  this->m_strmtyp = (uint8_t)uVar8;
  if ((uint8_t)uVar8 == '\x03') {
    return SYNC;
  }
  BitStreamReader::skipBits(&local_70,0xe);
  uVar8 = BitStreamReader::getBits(&local_70,2);
  uVar11 = BitStreamReader::getBits(&local_70,2);
  uVar15 = (ulong)uVar11;
  if ((char)uVar8 == '\x03') {
    if ((int)(uVar15 & 0xff) == 3) {
      return SYNC;
    }
    this->m_sample_rate = (uint)(ff_ac3_freqs[uVar15 & 0xff] >> 1);
    iVar7 = 6;
    uVar15 = CONCAT71((uint7)(uint3)(uVar11 >> 8),3);
LAB_001749d1:
    local_4c = 0;
  }
  else {
    this->m_sample_rate = (uint)ff_ac3_freqs[uVar8 & 0xff];
    if ((char)uVar11 != '\0') {
      if ((uVar11 & 0xff) == 1) {
        iVar7 = 2;
      }
      else if ((uVar11 & 0xff) == 2) {
        iVar7 = 3;
      }
      else {
        iVar7 = 6;
      }
      goto LAB_001749d1;
    }
    iVar7 = 1;
    local_4c = 1;
  }
  local_40 = uVar8;
  uVar8 = BitStreamReader::getBits(&local_70,3);
  local_38 = BitStreamReader::getBits(&local_70,1);
  bVar14 = "\x01\x02\x03\x06"[uVar15 & 0xff];
  this->m_samples = (uint)bVar14 << 8;
  this->m_bit_rateExt = (this->m_frame_size * this->m_sample_rate * 8) / (int)((uint)bVar14 << 8);
  BitStreamReader::skipBits(&local_70,5);
  bVar14 = 1;
  do {
    BitStreamReader::skipBits(&local_70,5);
    bVar4 = BitStreamReader::getBit(&local_70);
    if (bVar4) {
      BitStreamReader::skipBits(&local_70,8);
    }
    bVar16 = (byte)uVar8;
    bVar4 = (bool)(bVar16 == 0 & bVar14);
    bVar14 = 0;
  } while (bVar4);
  local_34 = (undefined4)uVar15;
  if (((this->m_strmtyp == '\x01') && (bVar4 = BitStreamReader::getBit(&local_70), bVar4)) &&
     (uVar11 = BitStreamReader::getBits(&local_70,0x10), (uVar11 & 0x7fe0) != 0)) {
    this->m_extChannelsExists = true;
  }
  bVar4 = BitStreamReader::getBit(&local_70);
  bVar14 = 0;
  bVar5 = false;
  uVar9 = 0;
  local_48 = 0;
  if (bVar4) {
    if ((2 < bVar16) && (BitStreamReader::skipBits(&local_70,2), (uVar8 & 1) != 0)) {
      BitStreamReader::skipBits(&local_70,6);
    }
    if ((uVar8 & 4) != 0) {
      BitStreamReader::skipBits(&local_70,6);
    }
    if (((char)local_38 != '\0') && (bVar4 = BitStreamReader::getBit(&local_70), bVar4)) {
      BitStreamReader::skipBits(&local_70,5);
    }
    bVar14 = 0;
    bVar5 = false;
    uVar9 = 0;
    local_48 = 0;
    if (this->m_strmtyp == '\0') {
      bVar4 = BitStreamReader::getBit(&local_70);
      uVar15 = CONCAT71(extraout_var,bVar4) & 0xffffffff;
      if (bVar4) {
        BitStreamReader::skipBits(&local_70,6);
      }
      if ((bVar16 == 0) && (bVar5 = BitStreamReader::getBit(&local_70), bVar5)) {
        BitStreamReader::skipBits(&local_70,6);
      }
      bVar5 = BitStreamReader::getBit(&local_70);
      uVar9 = (undefined4)CONCAT71(extraout_var_00,bVar5);
      if (bVar5) {
        BitStreamReader::skipBits(&local_70,6);
      }
      local_48 = BitStreamReader::getBits(&local_70,2);
      if ((char)local_48 == '\x01') {
        uVar11 = 5;
LAB_00174dc5:
        BitStreamReader::skipBits(&local_70,uVar11);
      }
      else if ((local_48 & 0xff) == 3) {
        local_3c = uVar9;
        uVar11 = BitStreamReader::getBits(&local_70,5);
        bVar5 = BitStreamReader::getBit(&local_70);
        if (bVar5) {
          local_44 = (uint)CONCAT71(extraout_var,bVar4);
          BitStreamReader::skipBits(&local_70,5);
          bVar4 = BitStreamReader::getBit(&local_70);
          if (bVar4) {
            BitStreamReader::skipBits(&local_70,4);
          }
          bVar4 = BitStreamReader::getBit(&local_70);
          if (bVar4) {
            BitStreamReader::skipBits(&local_70,4);
          }
          bVar4 = BitStreamReader::getBit(&local_70);
          if (bVar4) {
            BitStreamReader::skipBits(&local_70,4);
          }
          bVar4 = BitStreamReader::getBit(&local_70);
          if (bVar4) {
            BitStreamReader::skipBits(&local_70,4);
          }
          bVar4 = BitStreamReader::getBit(&local_70);
          if (bVar4) {
            BitStreamReader::skipBits(&local_70,4);
          }
          bVar4 = BitStreamReader::getBit(&local_70);
          if (bVar4) {
            BitStreamReader::skipBits(&local_70,4);
          }
          bVar4 = BitStreamReader::getBit(&local_70);
          if (bVar4) {
            BitStreamReader::skipBits(&local_70,4);
          }
          bVar4 = BitStreamReader::getBit(&local_70);
          uVar15 = (ulong)local_44;
          if (bVar4) {
            bVar4 = BitStreamReader::getBit(&local_70);
            if (bVar4) {
              BitStreamReader::skipBits(&local_70,4);
            }
            bVar4 = BitStreamReader::getBit(&local_70);
            uVar15 = (ulong)local_44;
            if (bVar4) {
              BitStreamReader::skipBits(&local_70,4);
            }
          }
        }
        bVar4 = BitStreamReader::getBit(&local_70);
        if (bVar4) {
          BitStreamReader::skipBits(&local_70,5);
          bVar4 = BitStreamReader::getBit(&local_70);
          if (bVar4) {
            BitStreamReader::skipBits(&local_70,7);
            bVar4 = BitStreamReader::getBit(&local_70);
            if (bVar4) {
              BitStreamReader::skipBits(&local_70,7);
            }
          }
        }
        iVar10 = (uVar11 & 0xff) + 2;
        do {
          BitStreamReader::skipBits(&local_70,8);
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
        uVar9 = local_3c;
        if ((local_70._24_8_ & 0x700000000) != 0) {
          uVar11 = 8 - (local_70.m_bitLeft & 7);
          goto LAB_00174dc5;
        }
      }
      else if ((local_48 & 0xff) == 2) {
        uVar11 = 0xc;
        goto LAB_00174dc5;
      }
      if (bVar16 < 2) {
        bVar5 = BitStreamReader::getBit(&local_70);
        if (bVar5) {
          BitStreamReader::skipBits(&local_70,0xe);
        }
        if ((bVar16 == 0) && (bVar4 = BitStreamReader::getBit(&local_70), bVar4)) {
          BitStreamReader::skipBits(&local_70,0xe);
        }
      }
      else {
        bVar5 = false;
      }
      bVar4 = BitStreamReader::getBit(&local_70);
      if (bVar4) {
        if ((char)local_4c == '\0') {
          local_44 = (uint)uVar15;
          do {
            bVar4 = BitStreamReader::getBit(&local_70);
            if (bVar4) {
              BitStreamReader::skipBits(&local_70,5);
            }
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          uVar15 = (ulong)local_44;
        }
        else {
          BitStreamReader::skipBits(&local_70,5);
        }
      }
      bVar14 = (byte)uVar15;
    }
  }
  local_3c = uVar9;
  bVar4 = BitStreamReader::getBit(&local_70);
  if (!bVar4) {
    uVar3 = '\0';
    local_4c = 0;
    bVar13 = (byte)local_40;
    goto LAB_00174f47;
  }
  local_4c = BitStreamReader::getBits(&local_70,3);
  BitStreamReader::skipBits(&local_70,2);
  bVar13 = (byte)local_40;
  if (bVar16 == 2) {
    uVar11 = BitStreamReader::getBits(&local_70,2);
    uVar6 = (uint8_t)uVar11;
LAB_00174ee9:
    uVar3 = uVar6;
    BitStreamReader::skipBits(&local_70,2);
  }
  else {
    uVar3 = '\0';
    uVar6 = '\0';
    if (5 < bVar16) goto LAB_00174ee9;
  }
  bVar4 = BitStreamReader::getBit(&local_70);
  if (bVar4) {
    BitStreamReader::skipBits(&local_70,8);
  }
  if ((bVar16 == 0) && (bVar4 = BitStreamReader::getBit(&local_70), bVar4)) {
    BitStreamReader::skipBits(&local_70,8);
  }
  if (bVar13 < 3) {
    BitStreamReader::skipBit(&local_70);
  }
LAB_00174f47:
  uVar6 = this->m_strmtyp;
  if ((char)local_34 != '\x03' && uVar6 == '\0') {
    BitStreamReader::skipBit(&local_70);
    uVar6 = this->m_strmtyp;
  }
  if ((uVar6 == '\x02') &&
     (((char)local_34 == '\x03' || (bVar4 = BitStreamReader::getBit(&local_70), bVar4)))) {
    BitStreamReader::skipBits(&local_70,6);
  }
  bVar4 = BitStreamReader::getBit(&local_70);
  if ((((bVar4) && (uVar11 = BitStreamReader::getBits(&local_70,6), uVar11 == 1)) &&
      (uVar11 = BitStreamReader::getBits(&local_70,8), uVar11 == 1)) &&
     (uVar11 = BitStreamReader::getBits(&local_70,8), uVar11 < 0x11)) {
    this->m_isAtmos = true;
  }
  this->m_mixinfoexists = (bool)(bVar5 | bVar14 | (byte)local_3c | (char)local_48 != '\0');
  if (this->m_channels == '\0') {
    this->m_acmod = bVar16;
    this->m_lfeon = (uint8_t)local_38;
    this->m_bsmod = (uint8_t)local_4c;
    this->m_fscod = bVar13;
    this->m_dsurmod = uVar3;
    this->m_channels = (uint8_t)local_38 + "\x02\x01\x02\x03\x03\x04\x04\x05"[uVar8 & 0xff];
  }
  return NO_ERROR;
}

Assistant:

AC3Codec::AC3ParseError AC3Codec::parseHeader(uint8_t *buf, const uint8_t *end)
{
    if (*buf++ != 0x0B || *buf++ != 0x77)
        return AC3ParseError::SYNC;

    // read ahead to bsid to make sure this is AC-3, not E-AC-3
    const uint8_t id = buf[3] >> 3;
    if (id > 16)
        return AC3ParseError::BSID;

    m_bsid = id;

    // ---------------------------------- EAC3 ------------------------------------------
    if (m_bsid > 10)
    {
        m_frame_size = static_cast<uint16_t>((((buf[0] & 0x07) << 8 | buf[1]) + 1) << 1);
        if (m_frame_size < AC3_HEADER_SIZE)
            return AC3ParseError::FRAME_SIZE;  // invalid header size

        if (end + 2 < m_frame_size + buf)
            return AC3ParseError::NOT_ENOUGH_BUFFER;

        if (!crc32(buf, m_frame_size - 4))
            return AC3ParseError::CRC2;

        uint8_t bsmod = 0, dsurmod = 0, numblkscod, mixdef = 0;
        int extpgmscle, paninfoe;
        int pgmscle = extpgmscle = paninfoe = 0;

        BitStreamReader gbc{};
        gbc.setBuffer(buf, end);

        m_strmtyp = gbc.getBits<uint8_t>(2);
        if (m_strmtyp == 3)
            return AC3ParseError::SYNC;  // invalid stream type

        gbc.skipBits(14);  // substreamid, frmsize

        const auto fscod = gbc.getBits<uint8_t>(2);

        if (fscod == 3)
        {
            const auto m_fscod2 = gbc.getBits<uint8_t>(2);
            if (m_fscod2 == 3)
                return AC3ParseError::SYNC;

            numblkscod = 3;
            m_sample_rate = ff_ac3_freqs[m_fscod2] / 2;
        }
        else
        {
            numblkscod = gbc.getBits<uint8_t>(2);
            m_sample_rate = ff_ac3_freqs[fscod];
        }
        const int number_of_blocks_per_syncframe =
            numblkscod == 0 ? 1 : (numblkscod == 1 ? 2 : (numblkscod == 2 ? 3 : 6));
        const auto acmod = gbc.getBits<uint8_t>(3);
        const auto lfeon = gbc.getBits<uint8_t>(1);

        m_samples = eac3_blocks[numblkscod] << 8;
        m_bit_rateExt = m_frame_size * m_sample_rate * 8 / m_samples;

        gbc.skipBits(5);  // skip bsid, already got it
        for (int i = 0; i < (acmod ? 1 : 2); i++)
        {
            gbc.skipBits(5);  // skip dialog normalization
            if (gbc.getBit())
                gbc.skipBits(8);  // skip Compression gain word
        }

        if (m_strmtyp == 1)  // dependent EAC3 frame
        {
            if (gbc.getBit())
            {
                const auto chanmap = gbc.getBits<int16_t>(16);
                if (chanmap & 0x7fe0)  // mask standard 5.1 channels
                    m_extChannelsExists = true;
            }
        }

        if (gbc.getBit())  // mixing metadata
        {
            if (acmod > 2)
                gbc.skipBits(2);  // dmixmod
            if (acmod & 1 && acmod > 0x2)
                gbc.skipBits(6);  // ltrtcmixlev, lorocmixlev
            if (acmod & 4)
                gbc.skipBits(6);  // ltrtsurmixlev, lorosurmixlev
            if (lfeon && gbc.getBit())
                gbc.skipBits(5);  // lfemixlevcod
            if (m_strmtyp == 0)   // independent EAC3 frame
            {
                pgmscle = gbc.getBit();
                if (pgmscle)
                    gbc.skipBits(6);  // pgmscl
                if (acmod == 0 && gbc.getBit())
                    gbc.skipBits(6);  // pgmscl2
                extpgmscle = gbc.getBit();
                if (extpgmscle)
                    gbc.skipBits(6);  // extpgmscl
                mixdef = gbc.getBits<uint8_t>(2);
                if (mixdef == 1)
                    gbc.skipBits(5);  // premixcmpsel, drcsrc, premixcmpscl
                else if (mixdef == 2)
                    gbc.skipBits(12);  // mixdata
                else if (mixdef == 3)
                {
                    const auto mixdeflen = gbc.getBits<uint8_t>(5);
                    if (gbc.getBit())  // mixdata2e
                    {
                        gbc.skipBits(5);  // premixcmpsel, drcsrc, premixcmpscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmlscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmcscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmrscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmlscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmrsscl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // extpgmlfescl
                        if (gbc.getBit())
                            gbc.skipBits(4);  // dmixscl
                        if (gbc.getBit())     // addch exist
                        {
                            if (gbc.getBit())     // extpgmaux1scl exist
                                gbc.skipBits(4);  // extpgmaux1scl
                            if (gbc.getBit())     // extpgmaux2scl exist
                                gbc.skipBits(4);  // extpgmaux2scl
                        }
                    }
                    if (gbc.getBit())  // mixdata3e
                    {
                        gbc.skipBits(5);   // spchdat
                        if (gbc.getBit())  // addspchdat exist
                        {
                            gbc.skipBits(7);      // spchdat1, spchan1att
                            if (gbc.getBit())     // addspchdat2 exist
                                gbc.skipBits(7);  // spchdat2, spchan2att
                        }
                    }
                    for (int i = 0; i < mixdeflen + 2; i++) gbc.skipBits(8);  // mixdata
                    gbc.alignByte();                                          // mixdatafill
                }
                if (acmod < 2)
                {
                    paninfoe = gbc.getBit();
                    if (paninfoe)
                        gbc.skipBits(14);  // panmean, paninfo
                    if (acmod == 0 && gbc.getBit())
                        gbc.skipBits(14);  // panmean2, paninfo2
                }
                if (gbc.getBit())
                {
                    if (numblkscod == 0)
                        gbc.skipBits(5);  // blkmixcfginfo[0]
                    else
                        for (int blk = 0; blk < number_of_blocks_per_syncframe; blk++)
                            if (gbc.getBit())
                                gbc.skipBits(5);  // blkmixcfginfo[blk]
                }
            }
        }

        if (gbc.getBit()) /* informational metadata */
        {
            bsmod = gbc.getBits<uint8_t>(3);
            gbc.skipBits(2);  // copyrightb, origbs
            if (acmod == 2)
            {
                dsurmod = gbc.getBits<uint8_t>(2);
                gbc.skipBits(2);  // dheadphonmod
            }
            else if (acmod >= 6)  /* if both surround channels exist */
                gbc.skipBits(2);  // dsurexmod
            if (gbc.getBit())     // audprodie
                gbc.skipBits(8);  // mixlevel, roomtype, adconvtyp
            if (acmod == 0)       /* if 1+1 mode (dual mono, so some items need a second value) */
            {
                if (gbc.getBit())     // audprodi2e
                    gbc.skipBits(8);  // mixlevel2, roomtype2, adconvtyp2
            }
            if (fscod < 3)      /* if not half sample rate */
                gbc.skipBit();  // sourcefscod
        }

        if (m_strmtyp == 0 && numblkscod != 3)
            gbc.skipBit();  // convsync

        if (m_strmtyp == 2) /* if bit stream converted from AC-3 */
        {
            if (numblkscod == 3 || gbc.getBit())  // blkid
                gbc.skipBits(6);                  // frmsizecod
        }

        if (gbc.getBit())  // addbsi exist
        {
            if (gbc.getBits(6) == 1)  // addbsi length
            {
                // ETSI TS 103 420 - Backwards-compatible object audio carriage using Enhanced AC-3
                // para. 8.3 Extensions contained in the addbsi bitstream field
                // TODO: conditions below might not be sufficient to detect Atmos
                // ideally, detect payload syncword (but where is it located ?)
                const auto flag_ec3_extension_type_a = gbc.getBits(8) == 1;
                if (flag_ec3_extension_type_a)
                {
                    const auto complexity_index_type_a = gbc.getBits(8);
                    if (complexity_index_type_a <= 16)
                        m_isAtmos = true;
                }
            }
        }

        m_mixinfoexists = pgmscle || extpgmscle || mixdef > 0 || paninfoe;

        if (m_channels == 0)  // no AC3 interleave
        {
            m_acmod = acmod;
            m_lfeon = lfeon;
            m_bsmod = bsmod;
            m_fscod = fscod;
            m_dsurmod = dsurmod;
            m_channels = static_cast<uint8_t>(ff_ac3_channels[acmod] + lfeon);
        }
    }
    // ---------------------------------- AC3 ------------------------------------------
    else
    {
        m_fscod = buf[2] >> 6;
        if (m_fscod == 3)
            return AC3ParseError::SAMPLE_RATE;

        m_frmsizecod = buf[2] & 0x3f;
        if (m_frmsizecod > 37)
            return AC3ParseError::FRAME_SIZE;

        m_frame_size = ff_ac3_frame_sizes[m_frmsizecod][m_fscod] << 1;
        if (end + 2 < m_frame_size + buf)
            return AC3ParseError::NOT_ENOUGH_BUFFER;

        if (!crc32(buf, m_frame_size - 4))
            return AC3ParseError::CRC2;

        BitStreamReader gbc{};
        gbc.setBuffer(buf + 3, end);

        m_bsidBase = m_bsid;  // id except AC3+ frames
        m_strmtyp = 2;
        m_samples = AC3_FRAME_SIZE;

        gbc.skipBits(5);  // skip bsid, already got it
        m_bsmod = gbc.getBits<uint8_t>(3);
        m_acmod = gbc.getBits<uint8_t>(3);
        if ((m_acmod & 1) && m_acmod != AC3_ACMOD_MONO)  // 3 front channels
            gbc.skipBits(2);                             // m_cmixlev
        if (m_acmod & 4)                                 // surround channel exists
            gbc.skipBits(2);                             // m_surmixlev
        if (m_acmod == AC3_ACMOD_STEREO)
            m_dsurmod = gbc.getBits<uint8_t>(2);
        m_lfeon = gbc.getBits<uint8_t>(1);

        m_halfratecod = max(m_bsid, 8) - 8;
        m_sample_rate = ff_ac3_freqs[m_fscod] >> m_halfratecod;
        m_bit_rate = (ff_ac3_bitratetab[m_frmsizecod >> 1] * 1000) >> m_halfratecod;
        m_channels = static_cast<uint8_t>(ff_ac3_channels[m_acmod] + m_lfeon);
    }
    return AC3ParseError::NO_ERROR;
}